

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O3

size_t __thiscall
duckdb_zstd::ZSTD_CCtx_setFParams(duckdb_zstd *this,ZSTD_CCtx *cctx,ZSTD_frameParameters fparams)

{
  if (*(int *)(this + 0xe18) != 0) {
    return 0xffffffffffffffc4;
  }
  *(uint *)(this + 0x30) = (uint)((int)cctx != 0);
  *(uint *)(this + 0x34) = (uint)((ulong)cctx >> 0x20 != 0);
  *(uint *)(this + 0x38) = (uint)(fparams.contentSizeFlag != 0);
  return 0;
}

Assistant:

size_t ZSTD_CCtx_setFParams(ZSTD_CCtx* cctx, ZSTD_frameParameters fparams)
{
    ZSTD_STATIC_ASSERT(sizeof(fparams) == 3 * 4 /* all params are listed below */);
    DEBUGLOG(4, "ZSTD_CCtx_setFParams");
    FORWARD_IF_ERROR(ZSTD_CCtx_setParameter(cctx, ZSTD_c_contentSizeFlag, fparams.contentSizeFlag != 0), "");
    FORWARD_IF_ERROR(ZSTD_CCtx_setParameter(cctx, ZSTD_c_checksumFlag, fparams.checksumFlag != 0), "");
    FORWARD_IF_ERROR(ZSTD_CCtx_setParameter(cctx, ZSTD_c_dictIDFlag, fparams.noDictIDFlag == 0), "");
    return 0;
}